

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O0

string * magic_tostr<unsigned_short>(unsigned_short magic)

{
  ostream *poVar1;
  char *pcVar2;
  ushort in_SI;
  string *in_RDI;
  stringstream stream;
  stringstream local_198 [16];
  ostream local_188 [382];
  ushort local_a;
  
  local_a = in_SI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"(");
  pcVar2 = type_name<unsigned_short>::get_name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,local_a);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string magic_tostr(_IntT magic) {
    // Don't use hex representation here. Some hex literals are considered unsigned, so
    // will cause a warning when cast to unsigned
    std::stringstream stream;
    stream << "(" << type_name<_IntT>::get_name() << ")" << magic;
    return stream.str();
}